

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt_string.c
# Opt level: O0

void * dropt_safe_realloc(void *p,size_t numElements,size_t elementSize)

{
  size_t numBytes;
  size_t elementSize_local;
  size_t numElements_local;
  void *p_local;
  
  if ((numElements == 0) || (elementSize == 0)) {
    free(p);
    if (elementSize == 0) {
      __assert_fail("elementSize != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt_string.c"
                    ,0x95,"void *dropt_safe_realloc(void *, size_t, size_t)");
    }
    p_local = (void *)0x0;
  }
  else if ((numElements * elementSize) / elementSize == numElements) {
    p_local = realloc(p,numElements * elementSize);
  }
  else {
    p_local = (void *)0x0;
  }
  return p_local;
}

Assistant:

void*
dropt_safe_realloc(void* p, size_t numElements, size_t elementSize)
{
    size_t numBytes;

    /* `elementSize` shouldn't legally be 0, but we check for it in case a
     * caller got the argument order wrong.
     */
    if (numElements == 0 || elementSize == 0)
    {
        /* The behavior of `realloc(p, 0)` is implementation-defined.  Let's
         * enforce a particular behavior.
         */
        free(p);

        assert(elementSize != 0);
        return NULL;
    }

    numBytes = numElements * elementSize;
    if (numBytes / elementSize != numElements)
    {
        /* Overflow. */
        return NULL;
    }

    return realloc(p, numBytes);
}